

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

void __thiscall tinyxml2::XMLNode::DeleteChildren(XMLNode *this)

{
  XMLNode *this_local;
  
  while (this->_firstChild != (XMLNode *)0x0) {
    DeleteChild(this,this->_firstChild);
  }
  this->_lastChild = (XMLNode *)0x0;
  this->_firstChild = (XMLNode *)0x0;
  return;
}

Assistant:

void XMLNode::DeleteChildren()
{
    while( _firstChild ) {
        TIXMLASSERT( _lastChild );
        DeleteChild( _firstChild );
    }
    _firstChild = _lastChild = 0;
}